

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_vmsumuhs_ppc64
               (CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint auStack_38 [4];
  uint32_t prod [8];
  
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    auStack_38[lVar2] = (uint)b->u16[lVar2] * (uint)a->u16[lVar2];
  }
  bVar1 = false;
  uVar4 = 7;
  for (uVar3 = 3; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    uVar5 = (ulong)auStack_38[uVar4] + (ulong)auStack_38[uVar4 - 1] + (ulong)c->u32[uVar3];
    if (uVar5 >> 0x20 != 0) {
      bVar1 = true;
    }
    if (0xfffffffe < uVar5) {
      uVar5 = 0xffffffff;
    }
    r->u32[uVar3] = (uint32_t)uVar5;
    uVar4 = uVar4 - 2;
  }
  if (bVar1) {
    (env->vscr_sat).u32[0] = 1;
  }
  return;
}

Assistant:

void helper_vmsumuhs(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    uint32_t prod[8];
    int i;
    int sat = 0;

    for (i = 0; i < ARRAY_SIZE(r->u16); i++) {
        prod[i] = a->u16[i] * b->u16[i];
    }

    VECTOR_FOR_INORDER_I(i, s32) {
        uint64_t t = (uint64_t)c->u32[i] + prod[2 * i] + prod[2 * i + 1];

        r->u32[i] = cvtuduw(t, &sat);
    }

    if (sat) {
        set_vscr_sat(env);
    }
}